

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O2

void * get_FMfieldAddr_by_name(FMFieldList field_list,char *fieldname,void *data)

{
  int iVar1;
  FMFieldList p_Var2;
  
  do {
    p_Var2 = field_list;
    if (p_Var2->field_name == (char *)0x0) {
      return (void *)0x0;
    }
    iVar1 = strcmp(p_Var2->field_name,fieldname);
    field_list = p_Var2 + 1;
  } while (iVar1 != 0);
  return (void *)((long)data + (long)p_Var2->field_offset);
}

Assistant:

extern void *
get_FMfieldAddr_by_name(FMFieldList field_list, const char *fieldname, void *data)
{
    int index;

    for (index = 0; field_list[index].field_name != NULL; index++) {
	if (strcmp(field_list[index].field_name, fieldname) == 0) {
	    break;
	}
    }
    if (field_list[index].field_name == NULL)
	return NULL;

    return ((char*)data) + field_list[index].field_offset;
}